

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# background_thread.c
# Opt level: O3

_Bool background_thread_create_locked(tsd_t *tsd,uint arena_ind)

{
  uint64_t *puVar1;
  witness_t **ppwVar2;
  int8_t *piVar3;
  tsd_t *tsd_00;
  background_thread_info_t *pbVar4;
  int iVar5;
  uint uVar6;
  void *arg;
  pthread_attr_t *attr;
  _func_void_ptr_void_ptr *extraout_RDX;
  _func_void_ptr_void_ptr *extraout_RDX_00;
  _func_void_ptr_void_ptr *start_routine;
  pthread_mutex_t *__mutex;
  _Bool _Var7;
  undefined4 in_register_00000034;
  background_thread_info_t *pbVar8;
  mutex_prof_data_t *data;
  atomic_b_t *paVar9;
  
  pbVar8 = (background_thread_info_t *)CONCAT44(in_register_00000034,arena_ind);
  attr = (pthread_attr_t *)((ulong)arena_ind % duckdb_je_max_background_threads);
  arg = (void *)((long)attr * 0xd0);
  tsd_00 = (tsd_t *)(duckdb_je_background_thread_info + (long)attr);
  pbVar4 = duckdb_je_background_thread_info + (long)attr;
  __mutex = (pthread_mutex_t *)
            ((long)&duckdb_je_background_thread_info[(long)attr].mtx.field_0 + 0x48);
  iVar5 = pthread_mutex_trylock(__mutex);
  if (iVar5 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&pbVar4->mtx);
    *(undefined1 *)
     &tsd_00->cant_access_tsd_items_directly_use_a_getter_or_setter_san_extents_until_guard_small =
         1;
  }
  tsd_00->cant_access_tsd_items_directly_use_a_getter_or_setter_prng_state =
       tsd_00->cant_access_tsd_items_directly_use_a_getter_or_setter_prng_state + 1;
  if ((tsd_t *)tsd_00->cant_access_tsd_items_directly_use_a_getter_or_setter_prof_tdata != tsd) {
    tsd_00->cant_access_tsd_items_directly_use_a_getter_or_setter_prof_tdata = (prof_tdata_t *)tsd;
    tsd_00->cant_access_tsd_items_directly_use_a_getter_or_setter_peak_dalloc_event_wait =
         tsd_00->cant_access_tsd_items_directly_use_a_getter_or_setter_peak_dalloc_event_wait + 1;
  }
  if (((duckdb_je_background_thread_enabled_state.repr & 1U) == 0) ||
     (*(int *)((tsd_00->cant_access_tsd_items_directly_use_a_getter_or_setter_binshards).binshard +
              7) != 0)) {
    paVar9 = (atomic_b_t *)
             &tsd_00->
              cant_access_tsd_items_directly_use_a_getter_or_setter_san_extents_until_guard_small;
    _Var7 = false;
  }
  else {
    background_thread_init(tsd_00,pbVar8);
    *(undefined1 *)
     &tsd_00->cant_access_tsd_items_directly_use_a_getter_or_setter_san_extents_until_guard_small =
         0;
    pthread_mutex_unlock(__mutex);
    pbVar8 = duckdb_je_background_thread_info;
    if (arena_ind == 0) {
      tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level =
           tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level + '\x01';
      start_routine = extraout_RDX;
      if ((tsd->state).repr == '\0') {
        duckdb_je_tsd_slow_update(tsd);
        start_routine = extraout_RDX_00;
      }
      uVar6 = background_thread_create_signals_masked((pthread_t *)tsd_00,attr,start_routine,arg);
      piVar3 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level;
      *piVar3 = *piVar3 + -1;
      if (*piVar3 == '\0') {
        duckdb_je_tsd_slow_update(tsd);
      }
      if (uVar6 == 0) {
        return false;
      }
      paVar9 = (atomic_b_t *)
               &tsd_00->
                cant_access_tsd_items_directly_use_a_getter_or_setter_san_extents_until_guard_small;
      duckdb_je_malloc_printf
                ("<jemalloc>: arena 0 background thread creation failed (%d)\n",(ulong)uVar6);
      iVar5 = pthread_mutex_trylock(__mutex);
      if (iVar5 != 0) {
        duckdb_je_malloc_mutex_lock_slow(&pbVar4->mtx);
        *paVar9 = true;
      }
      tsd_00->cant_access_tsd_items_directly_use_a_getter_or_setter_prng_state =
           tsd_00->cant_access_tsd_items_directly_use_a_getter_or_setter_prng_state + 1;
      if ((tsd_t *)tsd_00->cant_access_tsd_items_directly_use_a_getter_or_setter_prof_tdata != tsd)
      {
        tsd_00->cant_access_tsd_items_directly_use_a_getter_or_setter_prof_tdata =
             (prof_tdata_t *)tsd;
        tsd_00->cant_access_tsd_items_directly_use_a_getter_or_setter_peak_dalloc_event_wait =
             tsd_00->cant_access_tsd_items_directly_use_a_getter_or_setter_peak_dalloc_event_wait +
             1;
      }
      (tsd_00->cant_access_tsd_items_directly_use_a_getter_or_setter_binshards).binshard[7] = '\0';
      (tsd_00->cant_access_tsd_items_directly_use_a_getter_or_setter_binshards).binshard[8] = '\0';
      (tsd_00->cant_access_tsd_items_directly_use_a_getter_or_setter_binshards).binshard[9] = '\0';
      (tsd_00->cant_access_tsd_items_directly_use_a_getter_or_setter_binshards).binshard[10] = '\0';
      duckdb_je_n_background_threads = duckdb_je_n_background_threads - 1;
      _Var7 = true;
    }
    else {
      __mutex = (pthread_mutex_t *)((long)&(duckdb_je_background_thread_info->mtx).field_0 + 0x48);
      iVar5 = pthread_mutex_trylock(__mutex);
      if (iVar5 != 0) {
        duckdb_je_malloc_mutex_lock_slow(&pbVar8->mtx);
        (pbVar8->mtx).field_0.field_0.locked.repr = true;
      }
      puVar1 = &(pbVar8->mtx).field_0.field_0.prof_data.n_lock_ops;
      *puVar1 = *puVar1 + 1;
      if (&((pbVar8->mtx).field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
        (pbVar8->mtx).field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
        ppwVar2 = &(pbVar8->mtx).field_0.witness.link.qre_prev;
        *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
      }
      pthread_cond_signal((pthread_cond_t *)&pbVar8->cond);
      paVar9 = &(pbVar8->mtx).field_0.field_0.locked;
      _Var7 = false;
    }
  }
  paVar9->repr = false;
  pthread_mutex_unlock(__mutex);
  return _Var7;
}

Assistant:

static bool
background_thread_create_locked(tsd_t *tsd, unsigned arena_ind) {
	assert(have_background_thread);
	malloc_mutex_assert_owner(tsd_tsdn(tsd), &background_thread_lock);

	/* We create at most NCPUs threads. */
	size_t thread_ind = arena_ind % max_background_threads;
	background_thread_info_t *info = &background_thread_info[thread_ind];

	bool need_new_thread;
	malloc_mutex_lock(tsd_tsdn(tsd), &info->mtx);
	need_new_thread = background_thread_enabled() &&
	    (info->state == background_thread_stopped);
	if (need_new_thread) {
		background_thread_init(tsd, info);
	}
	malloc_mutex_unlock(tsd_tsdn(tsd), &info->mtx);
	if (!need_new_thread) {
		return false;
	}
	if (arena_ind != 0) {
		/* Threads are created asynchronously by Thread 0. */
		background_thread_info_t *t0 = &background_thread_info[0];
		malloc_mutex_lock(tsd_tsdn(tsd), &t0->mtx);
		assert(t0->state == background_thread_started);
		pthread_cond_signal(&t0->cond);
		malloc_mutex_unlock(tsd_tsdn(tsd), &t0->mtx);

		return false;
	}

	pre_reentrancy(tsd, NULL);
	/*
	 * To avoid complications (besides reentrancy), create internal
	 * background threads with the underlying pthread_create.
	 */
	int err = background_thread_create_signals_masked(&info->thread, NULL,
		/* NOLINTNEXTLINE(performance-no-int-to-ptr) */
	    background_thread_entry, (void *)thread_ind);
	post_reentrancy(tsd);

	if (err != 0) {
		malloc_printf("<jemalloc>: arena 0 background thread creation "
		    "failed (%d)\n", err);
		malloc_mutex_lock(tsd_tsdn(tsd), &info->mtx);
		info->state = background_thread_stopped;
		n_background_threads--;
		malloc_mutex_unlock(tsd_tsdn(tsd), &info->mtx);

		return true;
	}

	return false;
}